

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobHashTable.h
# Opt level: O2

Value ** __thiscall
ValueHashTable<Sym_*,_Value_*>::Get(ValueHashTable<Sym_*,_Value_*> *this,uint key)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *pSVar6;
  undefined1 local_40 [8];
  Iterator __iter;
  
  pSVar6 = this->table + (ulong)key % (ulong)this->tableSize;
  local_40 = (undefined1  [8])pSVar6;
  __iter.list = pSVar6;
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  do {
    if (pSVar6 == (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                         ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      pSVar6 = __iter.list;
    }
    __iter.list = (SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount> *)
                  (pSVar6->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])__iter.list == local_40) goto LAB_00403143;
    pTVar5 = SListBase<HashBucket<Sym_*,_Value_*>,_Memory::ArenaAllocator,_RealCount>::Iterator::
             Data((Iterator *)local_40);
    uVar1 = pTVar5->value->m_id;
    pSVar6 = __iter.list;
  } while (key < uVar1);
  if (uVar1 != key) {
LAB_00403143:
    pTVar5 = (Type *)0x0;
  }
  return &pTVar5->element;
}

Assistant:

TElement * Get(uint key)
    {
        uint hash = this->Hash(key);
        // Assumes sorted lists
        FOREACH_SLISTBASE_ENTRY(HashBucket, bucket, &this->table[hash])
        {
            if (Key::Get(bucket.value) <= key)
            {
                if (Key::Get(bucket.value) == key)
                {
                    return &(bucket.element);
                }
                break;
            }
        } NEXT_SLISTBASE_ENTRY;

        return NULL;
    }